

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
ChainstateManager::ProcessNewBlockHeaders
          (ChainstateManager *this,span<const_CBlockHeader,_18446744073709551615UL> headers,
          bool min_pow_checked,BlockValidationState *state,CBlockIndex **ppindex)

{
  long lVar1;
  CBlockIndex *pCVar2;
  bool bVar3;
  time_point tVar4;
  long lVar5;
  long lVar6;
  CBlockHeader *block;
  CBlockHeader *header;
  long lVar7;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  CBlockIndex *pindex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  
  block = headers._M_ptr;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock32,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x111f,false);
  lVar7 = headers._M_extent._M_extent_value._M_extent_value * 0x50;
  do {
    if (lVar7 == 0) {
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock32.super_unique_lock);
      bVar3 = NotifyHeaderTip(this);
      if (bVar3) {
        bVar3 = IsInitialBlockDownload(this);
        if ((ppindex != (CBlockIndex **)0x0 && bVar3) &&
           (pCVar2 = *ppindex, pCVar2 != (CBlockIndex *)0x0)) {
          tVar4 = NodeClock::now();
          lVar5 = (long)((long)tVar4.__d.__r + (ulong)pCVar2->nTime * -1000000000) /
                  ((((this->m_options).chainparams)->consensus).nPowTargetSpacing * 1000000000);
          lVar6 = 0;
          if (0 < lVar5) {
            lVar6 = lVar5;
          }
          criticalblock32.super_unique_lock._M_device =
               (mutex_type *)(((double)pCVar2->nHeight * 100.0) / (double)(lVar6 + pCVar2->nHeight))
          ;
          logging_function._M_str = "ProcessNewBlockHeaders";
          logging_function._M_len = 0x16;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file._M_len = 0x5e;
          LogPrintFormatInternal<int,double>
                    (logging_function,source_file,0x1133,ALL,Info,
                     (ConstevalFormatString<2U>)0x6c489b,&pCVar2->nHeight,
                     (double *)&criticalblock32.super_unique_lock);
        }
      }
LAB_00365ef5:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return lVar7 == 0;
      }
      __stack_chk_fail();
    }
    pindex = (CBlockIndex *)0x0;
    bVar3 = AcceptBlockHeader(this,block,state,&pindex,min_pow_checked);
    CheckBlockIndex(this);
    if (!bVar3) {
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock32.super_unique_lock);
      goto LAB_00365ef5;
    }
    if (ppindex != (CBlockIndex **)0x0) {
      *ppindex = pindex;
    }
    block = block + 1;
    lVar7 = lVar7 + -0x50;
  } while( true );
}

Assistant:

bool ChainstateManager::ProcessNewBlockHeaders(std::span<const CBlockHeader> headers, bool min_pow_checked, BlockValidationState& state, const CBlockIndex** ppindex)
{
    AssertLockNotHeld(cs_main);
    {
        LOCK(cs_main);
        for (const CBlockHeader& header : headers) {
            CBlockIndex *pindex = nullptr; // Use a temp pindex instead of ppindex to avoid a const_cast
            bool accepted{AcceptBlockHeader(header, state, &pindex, min_pow_checked)};
            CheckBlockIndex();

            if (!accepted) {
                return false;
            }
            if (ppindex) {
                *ppindex = pindex;
            }
        }
    }
    if (NotifyHeaderTip()) {
        if (IsInitialBlockDownload() && ppindex && *ppindex) {
            const CBlockIndex& last_accepted{**ppindex};
            int64_t blocks_left{(NodeClock::now() - last_accepted.Time()) / GetConsensus().PowTargetSpacing()};
            blocks_left = std::max<int64_t>(0, blocks_left);
            const double progress{100.0 * last_accepted.nHeight / (last_accepted.nHeight + blocks_left)};
            LogInfo("Synchronizing blockheaders, height: %d (~%.2f%%)\n", last_accepted.nHeight, progress);
        }
    }
    return true;
}